

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply.cc
# Opt level: O3

void __thiscall gvr::PLYWriter::addElement(PLYWriter *this,string *name,long instances)

{
  pointer *pppPVar1;
  iterator __position;
  PLYElement *this_00;
  IOException *this_01;
  string local_48;
  
  if (this->header_complete == true) {
    this_01 = (IOException *)__cxa_allocate_exception(0x28);
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_48,"Creation of ply header has been completed","");
    gutil::IOException::IOException(this_01,&local_48);
    __cxa_throw(this_01,&gutil::IOException::typeinfo,gutil::Exception::~Exception);
  }
  this_00 = (PLYElement *)operator_new(0x40);
  PLYElement::PLYElement(this_00,name,instances);
  this->element = this_00;
  __position._M_current =
       (this->list).super__Vector_base<gvr::PLYElement_*,_std::allocator<gvr::PLYElement_*>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current !=
      (this->list).super__Vector_base<gvr::PLYElement_*,_std::allocator<gvr::PLYElement_*>_>._M_impl
      .super__Vector_impl_data._M_end_of_storage) {
    *__position._M_current = this_00;
    pppPVar1 = &(this->list).
                super__Vector_base<gvr::PLYElement_*,_std::allocator<gvr::PLYElement_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
    *pppPVar1 = *pppPVar1 + 1;
    return;
  }
  std::vector<gvr::PLYElement*,std::allocator<gvr::PLYElement*>>::
  _M_realloc_insert<gvr::PLYElement*const&>
            ((vector<gvr::PLYElement*,std::allocator<gvr::PLYElement*>> *)&this->list,__position,
             &this->element);
  return;
}

Assistant:

void PLYWriter::addElement(const std::string &name, long instances)
{
  if (header_complete)
  {
    throw gutil::IOException("Creation of ply header has been completed");
  }

  element=new PLYElement(name, instances);

  list.push_back(element);
}